

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<3L>::by_box
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,RTree<3L> *this,Vector *box_a
          ,Vector *box_b,Callback *callback)

{
  PickByBox check;
  function<bool_(long)> fStack_b8;
  Vector local_98;
  Vector local_78;
  PickByBox local_58;
  
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [0];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [2];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [0];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [1];
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
       [2];
  PickByBox::PickByBox(&local_58,&local_78,&local_98);
  std::function<bool_(long)>::function(&fStack_b8,callback);
  RTree<3l>::search<anurbs::RTree<3l>::PickByBox>(__return_storage_ptr__,this,&local_58,&fStack_b8);
  std::_Function_base::~_Function_base(&fStack_b8.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> by_box(const Vector box_a, const Vector box_b, Callback callback=nullptr)
    {
        PickByBox check(box_a, box_b);
        return search(check, callback);
    }